

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_rect nk_layout_space_rect_to_local(nk_context *ctx,nk_rect ret)

{
  nk_panel *pnVar1;
  nk_rect nVar2;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx_local;
  nk_rect ret_local;
  
  pnVar1 = ctx->current->layout;
  ret_local.x = ret.x;
  ret_local.y = ret.y;
  nVar2.w = (float)(int)ret._8_8_;
  nVar2.h = (float)(int)((ulong)ret._8_8_ >> 0x20);
  nVar2.x = ret_local.x + ((float)*pnVar1->offset_x - pnVar1->at_x);
  nVar2.y = ret_local.y + ((float)*pnVar1->offset_y - pnVar1->at_y);
  return nVar2;
}

Assistant:

NK_API struct nk_rect
nk_layout_space_rect_to_local(struct nk_context *ctx, struct nk_rect ret)
{
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
win = ctx->current;
layout = win->layout;

ret.x += -layout->at_x + (float)*layout->offset_x;
ret.y += -layout->at_y + (float)*layout->offset_y;
return ret;
}